

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

const_iterator * __thiscall
density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
cbegin(const_iterator *__return_storage_ptr__,
      heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
      *this)

{
  ControlBlock *i_control;
  
  i_control = first_valid(this,this->m_head);
  const_iterator::const_iterator(__return_storage_ptr__,this,i_control);
  return __return_storage_ptr__;
}

Assistant:

const_iterator cbegin() const noexcept { return const_iterator(this, first_valid(m_head)); }